

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  stbir__contributors *psVar8;
  float *pfVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  float *pfVar24;
  
  uVar2 = stbir_info->channels;
  lVar12 = (long)(int)uVar2;
  pfVar7 = stbir_info->decode_buffer;
  iVar3 = stbir_info->horizontal_filter_pixel_margin;
  lVar13 = (long)(int)(iVar3 * uVar2);
  psVar8 = stbir_info->horizontal_contributors;
  pfVar9 = stbir_info->horizontal_coefficients;
  iVar4 = stbir_info->horizontal_coefficient_width;
  uVar16 = 0;
  uVar23 = 0;
  if (0 < (int)uVar2) {
    uVar23 = (ulong)uVar2;
  }
  uVar17 = (ulong)(uint)stbir_info->output_w;
  if (stbir_info->output_w < 1) {
    uVar17 = uVar16;
  }
  pfVar18 = output_buffer;
  pfVar24 = pfVar9;
  while( true ) {
    if (uVar16 == uVar17) {
      return;
    }
    iVar5 = psVar8[uVar16].n0;
    lVar14 = (long)iVar5;
    iVar6 = psVar8[uVar16].n1;
    lVar19 = (long)iVar6;
    if (iVar6 < iVar5) {
      __assert_fail("n1 >= n0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x5b5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (iVar5 < -iVar3) {
      __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x5b6,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    iVar10 = stbir_info->input_w + iVar3;
    if (iVar10 <= iVar5) break;
    if (iVar10 <= iVar6) {
      __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x5b9,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
    }
    if (uVar2 - 1 < 4) {
      lVar15 = uVar16 * lVar12;
      switch(uVar2) {
      case 1:
        for (lVar22 = 0; lVar14 + lVar22 <= lVar19; lVar22 = lVar22 + 1) {
          fVar1 = pfVar24[lVar22];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x5c1,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar15] = fVar1 * pfVar7[lVar13 + lVar14 + lVar22] + output_buffer[lVar15];
        }
        break;
      case 2:
        for (lVar22 = 0; lVar14 + lVar22 <= lVar19; lVar22 = lVar22 + 1) {
          fVar1 = pfVar24[lVar22];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x5ca,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar15] =
               pfVar7[lVar13 + lVar14 * 2 + lVar22 * 2] * fVar1 + output_buffer[lVar15];
          output_buffer[lVar15 + 1] =
               fVar1 * pfVar7[lVar13 + lVar14 * 2 + lVar22 * 2 + 1] + output_buffer[lVar15 + 1];
        }
        break;
      case 3:
        pfVar20 = pfVar7 + lVar13 + lVar14 * 3 + 2;
        for (lVar22 = 0; lVar14 + lVar22 <= lVar19; lVar22 = lVar22 + 1) {
          fVar1 = pfVar24[lVar22];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x5d4,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar15] = pfVar20[-2] * fVar1 + output_buffer[lVar15];
          output_buffer[lVar15 + 1] = pfVar20[-1] * fVar1 + output_buffer[lVar15 + 1];
          output_buffer[lVar15 + 2] = fVar1 * *pfVar20 + output_buffer[lVar15 + 2];
          pfVar20 = pfVar20 + 3;
        }
        break;
      case 4:
        lVar21 = 0;
        for (lVar22 = lVar14; lVar22 <= lVar19; lVar22 = lVar22 + 1) {
          fVar1 = *(float *)((long)pfVar24 + lVar21);
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                          ,0x5df,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          output_buffer[lVar15] =
               pfVar7[lVar13 + lVar14 * 4 + lVar21] * fVar1 + output_buffer[lVar15];
          output_buffer[lVar15 + 1] =
               pfVar7[lVar13 + lVar14 * 4 + lVar21 + 1] * fVar1 + output_buffer[lVar15 + 1];
          output_buffer[lVar15 + 2] =
               pfVar7[lVar13 + lVar14 * 4 + lVar21 + 2] * fVar1 + output_buffer[lVar15 + 2];
          output_buffer[lVar15 + 3] =
               fVar1 * pfVar7[lVar13 + lVar14 * 4 + lVar21 + 3] + output_buffer[lVar15 + 3];
          lVar21 = lVar21 + 4;
        }
      }
    }
    else {
      lVar22 = (long)pfVar7 + lVar14 * lVar12 * 4 + lVar13 * 4;
      lVar15 = 0;
      for (; lVar14 <= lVar19; lVar14 = lVar14 + 1) {
        fVar1 = pfVar9[uVar16 * (long)iVar4 + lVar15];
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          __assert_fail("coefficient != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x5ec,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
        }
        lVar15 = lVar15 + 1;
        for (uVar11 = 0; uVar23 != uVar11; uVar11 = uVar11 + 1) {
          pfVar18[uVar11] = *(float *)(lVar22 + uVar11 * 4) * fVar1 + pfVar18[uVar11];
        }
        lVar22 = lVar22 + lVar12 * 4;
      }
    }
    uVar16 = uVar16 + 1;
    pfVar24 = pfVar24 + iVar4;
    pfVar18 = pfVar18 + lVar12;
  }
  __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                ,0x5b8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}